

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_tree.h
# Opt level: O2

void __thiscall HuffTree::TreeNode::~TreeNode(TreeNode *this)

{
  std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
            (&this->_right);
  std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
            (&this->_left);
  return;
}

Assistant:

TreeNode() noexcept = default;